

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson.c
# Opt level: O1

uint8_t * bson_destroy_with_steal(bson_t *bson,_Bool steal,uint32_t *length)

{
  _Bool _Var1;
  int iVar2;
  uint8_t *puVar3;
  char *pcVar4;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  byte *pbVar5;
  undefined4 extraout_var_01;
  ulong uVar6;
  ulong __n;
  ulong __n_00;
  uint uVar7;
  bson_impl_alloc_t *alloc;
  long lVar8;
  undefined7 in_register_00000031;
  byte *__s;
  bson_iter_t bStack_280;
  bson_iter_t abStack_200 [2];
  bson_iter_t abStack_100 [2];
  
  __s = (byte *)CONCAT71(in_register_00000031,steal);
  if (bson != (bson_t *)0x0) {
    if (length != (uint32_t *)0x0) {
      *length = bson->len;
    }
    if ((steal) && ((bson->flags & 0x1c) == 0)) {
      if ((bson->flags & 1) == 0) {
        puVar3 = (uint8_t *)**(undefined8 **)(bson->padding + 0x10);
        **(undefined8 **)(bson->padding + 0x10) = 0;
      }
      else {
        puVar3 = (uint8_t *)bson_malloc((ulong)bson->len);
        memcpy(puVar3,bson->padding,(ulong)bson->len);
      }
    }
    else {
      puVar3 = (uint8_t *)0x0;
    }
    bson_destroy(bson);
    return puVar3;
  }
  bson_destroy_with_steal_cold_1();
  if (bson != (bson_t *)0x0) {
    _Var1 = bson_iter_init(abStack_100,bson);
    uVar7 = 0;
    if (_Var1) {
      uVar7 = 0xffffffff;
      do {
        _Var1 = bson_iter_next(abStack_100);
        uVar7 = uVar7 + 1;
      } while (_Var1);
    }
    return (uint8_t *)(ulong)uVar7;
  }
  bson_count_keys_cold_1();
  if (bson == (bson_t *)0x0) {
    bson_has_field_cold_2();
  }
  else if (__s != (byte *)0x0) {
    pcVar4 = strchr((char *)__s,0x2e);
    if (pcVar4 == (char *)0x0) {
      _Var1 = bson_iter_init_find(&bStack_280,bson,(char *)__s);
      puVar3 = (uint8_t *)CONCAT71(extraout_var_00,_Var1);
    }
    else {
      _Var1 = bson_iter_init(&bStack_280,bson);
      if (_Var1) {
        _Var1 = bson_iter_find_descendant(&bStack_280,(char *)__s,abStack_200);
        puVar3 = (uint8_t *)CONCAT71(extraout_var,_Var1);
      }
      else {
        puVar3 = (uint8_t *)0x0;
      }
    }
    return puVar3;
  }
  bson_has_field_cold_1();
  if ((bson->flags & 1) == 0) {
    puVar3 = (uint8_t *)(**(long **)(bson->padding + 0x10) + *(long *)(bson->padding + 0x20));
  }
  else {
    puVar3 = bson->padding;
  }
  __n_00 = (ulong)(bson->len - 4);
  if ((*__s & 1) == 0) {
    pbVar5 = (byte *)(**(long **)(__s + 0x18) + *(long *)(__s + 0x28));
  }
  else {
    pbVar5 = __s + 8;
  }
  if (bson->len != *(uint32_t *)(__s + 4)) {
    uVar6 = (ulong)(*(uint32_t *)(__s + 4) - 4);
    __n = uVar6;
    if (__n_00 < uVar6) {
      __n = __n_00;
    }
    iVar2 = memcmp(puVar3 + 4,pbVar5 + 4,__n);
    lVar8 = __n_00 - uVar6;
    if (iVar2 != 0) {
      lVar8 = (long)iVar2;
    }
    puVar3 = (uint8_t *)0xffffffff;
    if (-1 < lVar8) {
      puVar3 = (uint8_t *)(ulong)(0 < lVar8);
    }
    return puVar3;
  }
  iVar2 = memcmp(puVar3 + 4,pbVar5 + 4,__n_00);
  return (uint8_t *)CONCAT44(extraout_var_01,iVar2);
}

Assistant:

uint8_t *
bson_destroy_with_steal (bson_t *bson, bool steal, uint32_t *length)
{
   uint8_t *ret = NULL;

   BSON_ASSERT (bson);

   if (length) {
      *length = bson->len;
   }

   if (!steal) {
      bson_destroy (bson);
      return NULL;
   }

   if ((bson->flags &
        (BSON_FLAG_CHILD | BSON_FLAG_IN_CHILD | BSON_FLAG_RDONLY))) {
      /* Do nothing */
   } else if ((bson->flags & BSON_FLAG_INLINE)) {
      bson_impl_inline_t *inl;

      inl = (bson_impl_inline_t *) bson;
      ret = bson_malloc (bson->len);
      memcpy (ret, inl->data, bson->len);
   } else {
      bson_impl_alloc_t *alloc;

      alloc = (bson_impl_alloc_t *) bson;
      ret = *alloc->buf;
      *alloc->buf = NULL;
   }

   bson_destroy (bson);

   return ret;
}